

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationFastLatinBuilder::encodeTwoCEs
          (CollationFastLatinBuilder *this,int64_t first,int64_t second)

{
  uint32_t ter1;
  uint32_t sec1;
  uint32_t case1;
  uint32_t miniCE1;
  uint32_t c;
  uint32_t miniCE;
  int64_t second_local;
  int64_t first_local;
  CollationFastLatinBuilder *this_local;
  
  if (first == 0) {
    this_local._4_4_ = 0;
  }
  else if (first == 0x101000100) {
    this_local._4_4_ = 1;
  }
  else {
    miniCE1 = getMiniCE(this,first);
    this_local._4_4_ = miniCE1;
    if (miniCE1 != 1) {
      if (0xfff < miniCE1) {
        miniCE1 = (((uint)first & 0xc000) >> 0xb) + 8 | miniCE1;
      }
      if (second == 0) {
        this_local._4_4_ = miniCE1;
      }
      else {
        sec1 = getMiniCE(this,second);
        if (sec1 == 1) {
          this_local._4_4_ = 1;
        }
        else {
          if ((0xfff < miniCE1) && ((miniCE1 & 0x3e0) == 0xa0)) {
            if ((0x17f < (sec1 & 0x3e0)) && (((second & 0xc000U) == 0 && ((sec1 & 7) == 0)))) {
              return miniCE1 & 0xfffffc1f | sec1 & 0x3e0;
            }
          }
          if ((sec1 < 0x3e1) || (0xfff < sec1)) {
            sec1 = (((uint)second & 0xc000) >> 0xb) + 8 | sec1;
          }
          this_local._4_4_ = miniCE1 << 0x10 | sec1;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationFastLatinBuilder::encodeTwoCEs(int64_t first, int64_t second) const {
    if(first == 0) {
        return 0;  // completely ignorable
    }
    if(first == Collation::NO_CE) {
        return CollationFastLatin::BAIL_OUT;
    }
    U_ASSERT((uint32_t)(first >> 32) != Collation::NO_CE_PRIMARY);

    uint32_t miniCE = getMiniCE(first);
    if(miniCE == CollationFastLatin::BAIL_OUT) { return miniCE; }
    if(miniCE >= CollationFastLatin::MIN_SHORT) {
        // Extract & copy the case bits.
        // Shift them from normal CE bits 15..14 to mini CE bits 4..3.
        uint32_t c = (((uint32_t)first & Collation::CASE_MASK) >> (14 - 3));
        // Only in mini CEs: Ignorable case bits = 0, lowercase = 1.
        c += CollationFastLatin::LOWER_CASE;
        miniCE |= c;
    }
    if(second == 0) { return miniCE; }

    uint32_t miniCE1 = getMiniCE(second);
    if(miniCE1 == CollationFastLatin::BAIL_OUT) { return miniCE1; }

    uint32_t case1 = (uint32_t)second & Collation::CASE_MASK;
    if(miniCE >= CollationFastLatin::MIN_SHORT &&
            (miniCE & CollationFastLatin::SECONDARY_MASK) == CollationFastLatin::COMMON_SEC) {
        // Try to combine the two mini CEs into one.
        uint32_t sec1 = miniCE1 & CollationFastLatin::SECONDARY_MASK;
        uint32_t ter1 = miniCE1 & CollationFastLatin::TERTIARY_MASK;
        if(sec1 >= CollationFastLatin::MIN_SEC_HIGH && case1 == 0 &&
                ter1 == CollationFastLatin::COMMON_TER) {
            // sec1>=sec_high implies pri1==0.
            return (miniCE & ~CollationFastLatin::SECONDARY_MASK) | sec1;
        }
    }

    if(miniCE1 <= CollationFastLatin::SECONDARY_MASK || CollationFastLatin::MIN_SHORT <= miniCE1) {
        // Secondary CE, or a CE with a short primary, copy the case bits.
        case1 = (case1 >> (14 - 3)) + CollationFastLatin::LOWER_CASE;
        miniCE1 |= case1;
    }
    return (miniCE << 16) | miniCE1;
}